

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morton.cpp
# Opt level: O0

int32_t CompactBy3Bits21(uint64_t x)

{
  ulong uVar1;
  uint local_20;
  uint64_t d;
  uint64_t x_local;
  
  uVar1 = (x & 0x1249249249249249 | (x & 0x1249249249249249) >> 2) & 0x10c30c30c30c30c3;
  uVar1 = (uVar1 | uVar1 >> 4) & 0x100f00f00f00f00f;
  uVar1 = (uVar1 | uVar1 >> 8) & 0x1f0000ff0000ff;
  uVar1 = (uVar1 | uVar1 >> 0x10) & 0x1f00000000ffff;
  local_20 = (uint)uVar1 | (uint)(uVar1 >> 0x20);
  if ((uVar1 >> 0x20 & 0x100000) != 0) {
    local_20 = local_20 | 0xffe00000;
  }
  return local_20;
}

Assistant:

int32_t CompactBy3Bits21(uint64_t x)
{
    uint64_t d = x & 0x1249249249249249;
    d = (d | d >> 2) & 0x10c30c30c30c30c3;
    d = (d | d >> 4) & 0x100f00f00f00f00f;
    d = (d | d >> 8) & 0x1f0000ff0000ff;
    d = (d | d >> 16) & 0x1f00000000ffff;
    d = (d | d >> 32);

    // sign extension
    d = (d & 0x100000 ? d | 0xffe00000 : d);

    return (int32_t)d;
}